

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_geometry_device.cpp
# Opt level: O0

uint embree::addCube(RTCScene scene_i)

{
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RDI;
  uint geomID;
  Triangle *triangles;
  int tri;
  Vertex *vertices;
  RTCGeometry mesh;
  size_t in_stack_fffffffffffff8e8;
  size_t in_stack_fffffffffffff8f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  long local_628;
  int local_61c;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined4 *local_590;
  undefined8 local_588;
  undefined8 local_580;
  undefined4 local_574;
  undefined4 local_570;
  undefined4 local_56c;
  undefined8 *local_568;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined8 *local_550;
  undefined4 local_544;
  undefined4 local_540;
  undefined4 local_53c;
  undefined8 *local_538;
  undefined4 local_52c;
  undefined4 local_528;
  undefined4 local_524;
  undefined8 *local_520;
  undefined4 local_514;
  undefined4 local_510;
  undefined4 local_50c;
  undefined8 *local_508;
  undefined4 local_4fc;
  undefined4 local_4f8;
  undefined4 local_4f4;
  undefined8 *local_4f0;
  undefined4 local_4e4;
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined8 *local_4d8;
  undefined4 local_4cc;
  undefined4 local_4c8;
  undefined4 local_4c4;
  undefined8 *local_4c0;
  undefined4 local_4b4;
  undefined4 local_4b0;
  undefined4 local_4ac;
  undefined8 *local_4a8;
  undefined4 local_49c;
  undefined4 local_498;
  undefined4 local_494;
  undefined8 *local_490;
  undefined4 local_484;
  undefined4 local_480;
  undefined4 local_47c;
  undefined8 *local_478;
  undefined4 local_46c;
  undefined4 local_468;
  undefined4 local_464;
  undefined8 *local_460;
  undefined4 local_454;
  undefined4 local_450;
  undefined4 local_44c;
  undefined8 *local_448;
  undefined4 local_43c;
  undefined4 local_438;
  undefined4 local_434;
  undefined8 *local_430;
  undefined4 local_424;
  undefined4 local_420;
  undefined4 local_41c;
  undefined8 *local_418;
  undefined4 local_40c;
  undefined4 local_408;
  undefined4 local_404;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined4 *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  undefined8 *local_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  undefined8 *local_368;
  undefined8 *local_360;
  undefined8 *local_358;
  undefined8 *local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 *local_320;
  undefined8 *local_318;
  undefined8 *local_310;
  undefined8 *local_308;
  undefined8 *local_300;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  undefined4 local_2b4;
  undefined8 *local_2b0;
  undefined4 local_2a4;
  undefined8 *local_2a0;
  undefined4 local_294;
  undefined8 *local_290;
  undefined4 local_284;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined4 local_268;
  undefined4 local_264;
  undefined4 local_260;
  undefined4 local_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  undefined4 local_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  undefined4 local_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined4 local_208;
  undefined4 local_204;
  undefined4 local_200;
  undefined4 local_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined4 local_168;
  undefined4 local_164;
  undefined4 local_160;
  undefined4 local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined4 local_108;
  undefined4 local_104;
  undefined4 local_100;
  undefined4 local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined4 local_4;
  
  local_580 = in_RDI;
  local_588 = rtcNewGeometry(g_device);
  DAT_006033e8 = alignedUSMMalloc(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,DEFAULT);
  DAT_006033f0 = (undefined8 *)
                 alignedUSMMalloc(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,DEFAULT);
  local_590 = (undefined4 *)rtcSetNewGeometryBuffer(local_588,1,0,0x9003,0x10,8);
  puVar1 = DAT_006033f0;
  local_568 = &local_5a8;
  local_56c = 0;
  local_570 = 0;
  local_574 = 0;
  local_7c = 0;
  local_80 = 0;
  local_84 = 0;
  local_88 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_5a8 = 0;
  uStack_5a0 = 0;
  local_2c0 = DAT_006033f0;
  *DAT_006033f0 = 0;
  puVar1[1] = 0;
  *local_590 = 0xbf800000;
  local_590[1] = 0xbf800000;
  local_590[2] = 0xbf800000;
  puVar1 = DAT_006033f0;
  local_550 = &local_5b8;
  local_554 = 0;
  local_558 = 0;
  local_55c = 0x3f800000;
  local_9c = 0;
  local_a0 = 0x3f800000;
  local_a4 = 0;
  local_a8 = 0;
  local_b8 = 0;
  uStack_b0 = 0x3f800000;
  local_5b8 = 0;
  uStack_5b0 = 0x3f800000;
  local_2d0 = DAT_006033f0 + 2;
  *local_2d0 = 0;
  puVar1[3] = 0x3f800000;
  local_590[4] = 0xbf800000;
  local_590[5] = 0xbf800000;
  local_590[6] = 0x3f800000;
  puVar1 = DAT_006033f0;
  local_538 = &local_5c8;
  local_53c = 0;
  local_540 = 0x3f800000;
  local_544 = 0;
  local_bc = 0;
  local_c0 = 0;
  local_c4 = 0x3f800000;
  local_c8 = 0;
  local_d8 = 0x3f80000000000000;
  uStack_d0 = 0;
  local_5c8 = 0x3f80000000000000;
  uStack_5c0 = 0;
  local_2e0 = DAT_006033f0 + 4;
  *local_2e0 = 0x3f80000000000000;
  puVar1[5] = 0;
  local_590[8] = 0xbf800000;
  local_590[9] = 0x3f800000;
  local_590[10] = 0xbf800000;
  puVar1 = DAT_006033f0;
  local_520 = &local_5d8;
  local_524 = 0;
  local_528 = 0x3f800000;
  local_52c = 0x3f800000;
  local_dc = 0;
  local_e0 = 0x3f800000;
  local_e4 = 0x3f800000;
  local_e8 = 0;
  local_f8 = 0x3f80000000000000;
  uStack_f0 = 0x3f800000;
  local_5d8 = 0x3f80000000000000;
  uStack_5d0 = 0x3f800000;
  local_2f0 = DAT_006033f0 + 6;
  *local_2f0 = 0x3f80000000000000;
  puVar1[7] = 0x3f800000;
  local_590[0xc] = 0xbf800000;
  local_590[0xd] = 0x3f800000;
  local_590[0xe] = 0x3f800000;
  puVar1 = DAT_006033f0;
  local_508 = &local_5e8;
  local_50c = 0x3f800000;
  local_510 = 0;
  local_514 = 0;
  local_fc = 0;
  local_100 = 0;
  local_104 = 0;
  local_108 = 0x3f800000;
  local_118 = 0x3f800000;
  uStack_110 = 0;
  local_5e8 = 0x3f800000;
  uStack_5e0 = 0;
  local_300 = DAT_006033f0 + 8;
  *local_300 = 0x3f800000;
  puVar1[9] = 0;
  local_590[0x10] = 0x3f800000;
  local_590[0x11] = 0xbf800000;
  local_590[0x12] = 0xbf800000;
  puVar1 = DAT_006033f0;
  local_4f0 = &local_5f8;
  local_4f4 = 0x3f800000;
  local_4f8 = 0;
  local_4fc = 0x3f800000;
  local_11c = 0;
  local_120 = 0x3f800000;
  local_124 = 0;
  local_128 = 0x3f800000;
  local_138 = 0x3f800000;
  uStack_130 = 0x3f800000;
  local_5f8 = 0x3f800000;
  uStack_5f0 = 0x3f800000;
  local_310 = DAT_006033f0 + 10;
  *local_310 = 0x3f800000;
  puVar1[0xb] = 0x3f800000;
  local_590[0x14] = 0x3f800000;
  local_590[0x15] = 0xbf800000;
  local_590[0x16] = 0x3f800000;
  puVar1 = DAT_006033f0;
  local_4d8 = &local_608;
  local_4dc = 0x3f800000;
  local_4e0 = 0x3f800000;
  local_4e4 = 0;
  local_13c = 0;
  local_140 = 0;
  local_144 = 0x3f800000;
  local_148 = 0x3f800000;
  local_158 = 0x3f8000003f800000;
  uStack_150 = 0;
  local_608 = 0x3f8000003f800000;
  uStack_600 = 0;
  local_320 = DAT_006033f0 + 0xc;
  *local_320 = 0x3f8000003f800000;
  puVar1[0xd] = 0;
  local_590[0x18] = 0x3f800000;
  local_590[0x19] = 0x3f800000;
  local_590[0x1a] = 0xbf800000;
  puVar1 = DAT_006033f0;
  local_4c0 = &local_618;
  local_4c4 = 0x3f800000;
  local_4c8 = 0x3f800000;
  local_4cc = 0x3f800000;
  local_15c = 0;
  local_160 = 0x3f800000;
  local_164 = 0x3f800000;
  local_168 = 0x3f800000;
  local_178 = 0x3f8000003f800000;
  uStack_170 = 0x3f800000;
  local_618 = 0x3f8000003f800000;
  uStack_610 = 0x3f800000;
  local_330 = DAT_006033f0 + 0xe;
  *(undefined4 *)local_330 = 0x3f800000;
  *(undefined4 *)((long)puVar1 + 0x74) = 0x3f800000;
  *(undefined4 *)(puVar1 + 0xf) = 0x3f800000;
  *(undefined4 *)((long)puVar1 + 0x7c) = 0;
  local_590[0x1c] = 0x3f800000;
  local_590[0x1d] = 0x3f800000;
  local_590[0x1e] = 0x3f800000;
  local_61c = 0;
  local_338 = local_4c0;
  local_328 = local_4d8;
  local_318 = local_4f0;
  local_308 = local_508;
  local_2f8 = local_520;
  local_2e8 = local_538;
  local_2d8 = local_550;
  local_2c8 = local_568;
  local_628 = rtcSetNewGeometryBuffer(local_588,0,0,0x5003,0xc);
  local_4a8 = &local_638;
  local_4ac = 0x3f800000;
  local_4b0 = 0;
  local_4b4 = 0;
  local_17c = 0;
  local_180 = 0;
  local_184 = 0;
  local_188 = 0x3f800000;
  local_198 = 0x3f800000;
  uStack_190 = 0;
  local_638 = 0x3f800000;
  uStack_630 = 0;
  local_340 = (undefined8 *)((long)DAT_006033e8 + (long)local_61c * 0x10);
  *local_340 = 0x3f800000;
  local_340[1] = 0;
  *(undefined4 *)(local_628 + (long)local_61c * 0xc) = 0;
  *(undefined4 *)(local_628 + 4 + (long)local_61c * 0xc) = 1;
  *(undefined4 *)(local_628 + 8 + (long)local_61c * 0xc) = 2;
  iVar2 = local_61c + 1;
  local_490 = &local_648;
  local_494 = 0x3f800000;
  local_498 = 0;
  local_49c = 0;
  local_19c = 0;
  local_1a0 = 0;
  local_1a4 = 0;
  local_1a8 = 0x3f800000;
  local_1b8 = 0x3f800000;
  uStack_1b0 = 0;
  local_648 = 0x3f800000;
  uStack_640 = 0;
  local_350 = (undefined8 *)((long)DAT_006033e8 + (long)iVar2 * 0x10);
  *local_350 = 0x3f800000;
  local_350[1] = 0;
  *(undefined4 *)(local_628 + (long)iVar2 * 0xc) = 1;
  *(undefined4 *)(local_628 + 4 + (long)iVar2 * 0xc) = 3;
  *(undefined4 *)(local_628 + 8 + (long)iVar2 * 0xc) = 2;
  iVar2 = local_61c + 2;
  local_478 = &local_658;
  local_47c = 0;
  local_480 = 0x3f800000;
  local_484 = 0;
  local_1bc = 0;
  local_1c0 = 0;
  local_1c4 = 0x3f800000;
  local_1c8 = 0;
  local_1d8 = 0x3f80000000000000;
  uStack_1d0 = 0;
  local_658 = 0x3f80000000000000;
  uStack_650 = 0;
  local_360 = (undefined8 *)((long)DAT_006033e8 + (long)iVar2 * 0x10);
  *local_360 = 0x3f80000000000000;
  local_360[1] = 0;
  *(undefined4 *)(local_628 + (long)iVar2 * 0xc) = 4;
  *(undefined4 *)(local_628 + 4 + (long)iVar2 * 0xc) = 6;
  *(undefined4 *)(local_628 + 8 + (long)iVar2 * 0xc) = 5;
  iVar2 = local_61c + 3;
  local_460 = &local_668;
  local_464 = 0;
  local_468 = 0x3f800000;
  local_46c = 0;
  local_1dc = 0;
  local_1e0 = 0;
  local_1e4 = 0x3f800000;
  local_1e8 = 0;
  local_1f8 = 0x3f80000000000000;
  uStack_1f0 = 0;
  local_668 = 0x3f80000000000000;
  uStack_660 = 0;
  local_370 = (undefined8 *)((long)DAT_006033e8 + (long)iVar2 * 0x10);
  *local_370 = 0x3f80000000000000;
  local_370[1] = 0;
  *(undefined4 *)(local_628 + (long)iVar2 * 0xc) = 5;
  *(undefined4 *)(local_628 + 4 + (long)iVar2 * 0xc) = 6;
  *(undefined4 *)(local_628 + 8 + (long)iVar2 * 0xc) = 7;
  iVar2 = local_61c + 4;
  local_388 = &local_678;
  local_2b4 = 0x3f000000;
  local_4 = 0x3f000000;
  local_18 = 0x3f000000;
  uStack_14 = 0x3f000000;
  uStack_10 = 0x3f000000;
  uStack_c = 0x3f000000;
  local_678 = 0x3f0000003f000000;
  uStack_670 = 0x3f0000003f000000;
  local_380 = (undefined8 *)((long)DAT_006033e8 + (long)iVar2 * 0x10);
  *local_380 = 0x3f0000003f000000;
  local_380[1] = 0x3f0000003f000000;
  *(undefined4 *)(local_628 + (long)iVar2 * 0xc) = 0;
  *(undefined4 *)(local_628 + 4 + (long)iVar2 * 0xc) = 4;
  *(undefined4 *)(local_628 + 8 + (long)iVar2 * 0xc) = 1;
  iVar2 = local_61c + 5;
  local_398 = &local_688;
  local_2a4 = 0x3f000000;
  local_1c = 0x3f000000;
  local_38 = 0x3f000000;
  uStack_34 = 0x3f000000;
  uStack_30 = 0x3f000000;
  uStack_2c = 0x3f000000;
  local_688 = 0x3f0000003f000000;
  uStack_680 = 0x3f0000003f000000;
  local_390 = (undefined8 *)((long)DAT_006033e8 + (long)iVar2 * 0x10);
  *local_390 = 0x3f0000003f000000;
  local_390[1] = 0x3f0000003f000000;
  *(undefined4 *)(local_628 + (long)iVar2 * 0xc) = 1;
  *(undefined4 *)(local_628 + 4 + (long)iVar2 * 0xc) = 4;
  *(undefined4 *)(local_628 + 8 + (long)iVar2 * 0xc) = 5;
  iVar2 = local_61c + 6;
  local_3a8 = &local_698;
  local_294 = 0x3f800000;
  local_3c = 0x3f800000;
  local_58 = 0x3f800000;
  uStack_54 = 0x3f800000;
  uStack_50 = 0x3f800000;
  uStack_4c = 0x3f800000;
  local_698 = 0x3f8000003f800000;
  uStack_690 = 0x3f8000003f800000;
  local_3a0 = (undefined8 *)((long)DAT_006033e8 + (long)iVar2 * 0x10);
  *local_3a0 = 0x3f8000003f800000;
  local_3a0[1] = 0x3f8000003f800000;
  *(undefined4 *)(local_628 + (long)iVar2 * 0xc) = 2;
  *(undefined4 *)(local_628 + 4 + (long)iVar2 * 0xc) = 3;
  *(undefined4 *)(local_628 + 8 + (long)iVar2 * 0xc) = 6;
  iVar2 = local_61c + 7;
  local_3b8 = &local_6a8;
  local_284 = 0x3f800000;
  local_5c = 0x3f800000;
  local_78 = 0x3f800000;
  uStack_74 = 0x3f800000;
  uStack_70 = 0x3f800000;
  uStack_6c = 0x3f800000;
  local_6a8 = 0x3f8000003f800000;
  uStack_6a0 = 0x3f8000003f800000;
  local_3b0 = (undefined8 *)((long)DAT_006033e8 + (long)iVar2 * 0x10);
  *local_3b0 = 0x3f8000003f800000;
  local_3b0[1] = 0x3f8000003f800000;
  *(undefined4 *)(local_628 + (long)iVar2 * 0xc) = 3;
  *(undefined4 *)(local_628 + 4 + (long)iVar2 * 0xc) = 7;
  *(undefined4 *)(local_628 + 8 + (long)iVar2 * 0xc) = 6;
  iVar2 = local_61c + 8;
  local_448 = &local_6b8;
  local_44c = 0;
  local_450 = 0;
  local_454 = 0x3f800000;
  local_1fc = 0;
  local_200 = 0x3f800000;
  local_204 = 0;
  local_208 = 0;
  local_218 = 0;
  uStack_210 = 0x3f800000;
  local_6b8 = 0;
  uStack_6b0 = 0x3f800000;
  local_3c0 = (undefined8 *)((long)DAT_006033e8 + (long)iVar2 * 0x10);
  *local_3c0 = 0;
  local_3c0[1] = 0x3f800000;
  *(undefined4 *)(local_628 + (long)iVar2 * 0xc) = 0;
  *(undefined4 *)(local_628 + 4 + (long)iVar2 * 0xc) = 2;
  *(undefined4 *)(local_628 + 8 + (long)iVar2 * 0xc) = 4;
  iVar2 = local_61c + 9;
  local_430 = &local_6c8;
  local_434 = 0;
  local_438 = 0;
  local_43c = 0x3f800000;
  local_21c = 0;
  local_220 = 0x3f800000;
  local_224 = 0;
  local_228 = 0;
  local_238 = 0;
  uStack_230 = 0x3f800000;
  local_6c8 = 0;
  uStack_6c0 = 0x3f800000;
  local_3d0 = (undefined8 *)((long)DAT_006033e8 + (long)iVar2 * 0x10);
  *local_3d0 = 0;
  local_3d0[1] = 0x3f800000;
  *(undefined4 *)(local_628 + (long)iVar2 * 0xc) = 2;
  *(undefined4 *)(local_628 + 4 + (long)iVar2 * 0xc) = 6;
  *(undefined4 *)(local_628 + 8 + (long)iVar2 * 0xc) = 4;
  iVar2 = local_61c + 10;
  local_418 = &local_6d8;
  local_41c = 0x3f800000;
  local_420 = 0x3f800000;
  local_424 = 0;
  local_23c = 0;
  local_240 = 0;
  local_244 = 0x3f800000;
  local_248 = 0x3f800000;
  local_258 = 0x3f8000003f800000;
  uStack_250 = 0;
  local_6d8 = 0x3f8000003f800000;
  uStack_6d0 = 0;
  local_3e0 = (undefined8 *)((long)DAT_006033e8 + (long)iVar2 * 0x10);
  *local_3e0 = 0x3f8000003f800000;
  local_3e0[1] = 0;
  *(undefined4 *)(local_628 + (long)iVar2 * 0xc) = 1;
  *(undefined4 *)(local_628 + 4 + (long)iVar2 * 0xc) = 5;
  *(undefined4 *)(local_628 + 8 + (long)iVar2 * 0xc) = 3;
  iVar2 = local_61c + 0xb;
  local_400 = &local_6e8;
  local_404 = 0x3f800000;
  local_408 = 0x3f800000;
  local_40c = 0;
  local_25c = 0;
  local_260 = 0;
  local_264 = 0x3f800000;
  local_268 = 0x3f800000;
  local_278 = 0x3f8000003f800000;
  uStack_270 = 0;
  local_6e8 = 0x3f8000003f800000;
  uStack_6e0 = 0;
  local_3f0 = (undefined4 *)((long)DAT_006033e8 + (long)iVar2 * 0x10);
  local_3f8 = &local_6e8;
  *local_3f0 = 0x3f800000;
  local_3f0[1] = 0x3f800000;
  local_3f0[2] = 0;
  local_3f0[3] = 0;
  *(undefined4 *)(local_628 + (long)iVar2 * 0xc) = 3;
  *(undefined4 *)(local_628 + (long)iVar2 * 0xc + 4) = 5;
  *(undefined4 *)(local_628 + (long)iVar2 * 0xc + 8) = 7;
  local_61c = local_61c + 0xc;
  local_3e8 = local_418;
  local_3d8 = local_430;
  local_3c8 = local_448;
  local_378 = local_460;
  local_368 = local_478;
  local_358 = local_490;
  local_348 = local_4a8;
  local_2b0 = local_388;
  local_2a0 = local_398;
  local_290 = local_3a8;
  local_280 = local_3b8;
  rtcSetGeometryVertexAttributeCount(local_588,1);
  rtcSetSharedGeometryBuffer(local_588,2,0,0x9003,DAT_006033f0,0,0x10,8);
  rtcCommitGeometry(local_588);
  uVar3 = rtcAttachGeometry(local_580,local_588);
  rtcReleaseGeometry(local_588);
  return uVar3;
}

Assistant:

unsigned int addCube (RTCScene scene_i)
{
  /* create a triangulated cube with 12 triangles and 8 vertices */
  RTCGeometry mesh = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_TRIANGLE);

  /* create face and vertex color arrays */
  data.face_colors = (Vec3fa*) alignedUSMMalloc((12)*sizeof(Vec3fa),16);
  data.vertex_colors = (Vec3fa*) alignedUSMMalloc((8)*sizeof(Vec3fa),16);

  /* set vertices and vertex colors */
  Vertex* vertices = (Vertex*) rtcSetNewGeometryBuffer(mesh,RTC_BUFFER_TYPE_VERTEX,0,RTC_FORMAT_FLOAT3,sizeof(Vertex),8);
  data.vertex_colors[0] = Vec3fa(0,0,0); vertices[0].x = -1; vertices[0].y = -1; vertices[0].z = -1;
  data.vertex_colors[1] = Vec3fa(0,0,1); vertices[1].x = -1; vertices[1].y = -1; vertices[1].z = +1;
  data.vertex_colors[2] = Vec3fa(0,1,0); vertices[2].x = -1; vertices[2].y = +1; vertices[2].z = -1;
  data.vertex_colors[3] = Vec3fa(0,1,1); vertices[3].x = -1; vertices[3].y = +1; vertices[3].z = +1;
  data.vertex_colors[4] = Vec3fa(1,0,0); vertices[4].x = +1; vertices[4].y = -1; vertices[4].z = -1;
  data.vertex_colors[5] = Vec3fa(1,0,1); vertices[5].x = +1; vertices[5].y = -1; vertices[5].z = +1;
  data.vertex_colors[6] = Vec3fa(1,1,0); vertices[6].x = +1; vertices[6].y = +1; vertices[6].z = -1;
  data.vertex_colors[7] = Vec3fa(1,1,1); vertices[7].x = +1; vertices[7].y = +1; vertices[7].z = +1;

  /* set triangles and face colors */
  int tri = 0;
  Triangle* triangles = (Triangle*) rtcSetNewGeometryBuffer(mesh,RTC_BUFFER_TYPE_INDEX,0,RTC_FORMAT_UINT3,sizeof(Triangle),12);

  // left side
  data.face_colors[tri] = Vec3fa(1,0,0); triangles[tri].v0 = 0; triangles[tri].v1 = 1; triangles[tri].v2 = 2; tri++;
  data.face_colors[tri] = Vec3fa(1,0,0); triangles[tri].v0 = 1; triangles[tri].v1 = 3; triangles[tri].v2 = 2; tri++;

  // right side
  data.face_colors[tri] = Vec3fa(0,1,0); triangles[tri].v0 = 4; triangles[tri].v1 = 6; triangles[tri].v2 = 5; tri++;
  data.face_colors[tri] = Vec3fa(0,1,0); triangles[tri].v0 = 5; triangles[tri].v1 = 6; triangles[tri].v2 = 7; tri++;

  // bottom side
  data.face_colors[tri] = Vec3fa(0.5f);  triangles[tri].v0 = 0; triangles[tri].v1 = 4; triangles[tri].v2 = 1; tri++;
  data.face_colors[tri] = Vec3fa(0.5f);  triangles[tri].v0 = 1; triangles[tri].v1 = 4; triangles[tri].v2 = 5; tri++;

  // top side
  data.face_colors[tri] = Vec3fa(1.0f);  triangles[tri].v0 = 2; triangles[tri].v1 = 3; triangles[tri].v2 = 6; tri++;
  data.face_colors[tri] = Vec3fa(1.0f);  triangles[tri].v0 = 3; triangles[tri].v1 = 7; triangles[tri].v2 = 6; tri++;

  // front side
  data.face_colors[tri] = Vec3fa(0,0,1); triangles[tri].v0 = 0; triangles[tri].v1 = 2; triangles[tri].v2 = 4; tri++;
  data.face_colors[tri] = Vec3fa(0,0,1); triangles[tri].v0 = 2; triangles[tri].v1 = 6; triangles[tri].v2 = 4; tri++;

  // back side
  data.face_colors[tri] = Vec3fa(1,1,0); triangles[tri].v0 = 1; triangles[tri].v1 = 5; triangles[tri].v2 = 3; tri++;
  data.face_colors[tri] = Vec3fa(1,1,0); triangles[tri].v0 = 3; triangles[tri].v1 = 5; triangles[tri].v2 = 7; tri++;

  rtcSetGeometryVertexAttributeCount(mesh,1);
  rtcSetSharedGeometryBuffer(mesh,RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE,0,RTC_FORMAT_FLOAT3,data.vertex_colors,0,sizeof(Vec3fa),8);
  
  rtcCommitGeometry(mesh);
  unsigned int geomID = rtcAttachGeometry(scene_i,mesh);
  rtcReleaseGeometry(mesh);
  return geomID;
}